

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
llvm::cl::TokenizeGNUCommandLine
          (cl *this,StringRef Src,StringSaver *Saver,SmallVectorImpl<const_char_*> *NewArgv,
          bool MarkEOLs)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  char *Index;
  size_t E;
  StringRef SVar5;
  StringRef S;
  char C;
  SmallString<128U> Token;
  byte local_e9;
  char *local_e8;
  SmallVectorTemplateBase<const_char_*,_true> *local_e0;
  StringSaver *local_d8;
  SmallVectorImpl<char> local_d0;
  undefined1 local_c0 [128];
  StringRef local_40;
  
  local_d8 = (StringSaver *)Src.Length;
  pcVar3 = Src.Data;
  local_d0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_c0;
  local_d0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_d0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  pcVar4 = (char *)0x0;
  local_e0 = (SmallVectorTemplateBase<const_char_*,_true> *)Saver;
  local_40.Data = (char *)this;
  local_40.Length = (size_t)pcVar3;
  do {
    if (pcVar4 == pcVar3) {
LAB_00139b34:
      if (local_d0.super_SmallVectorTemplateBase<char,_true>.
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0) {
        SVar5.Length._0_4_ =
             local_d0.super_SmallVectorTemplateBase<char,_true>.
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        SVar5.Data = (char *)local_d0.super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX;
        SVar5.Length._4_4_ = 0;
        SVar5 = StringSaver::save(local_d8,SVar5);
        local_e8 = SVar5.Data;
        SmallVectorTemplateBase<const_char_*,_true>::push_back
                  ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_e8);
      }
      if ((char)NewArgv != '\0') {
        local_e8 = (char *)0x0;
        SmallVectorTemplateBase<const_char_*,_true>::push_back
                  ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_e8);
      }
      SmallVectorImpl<char>::~SmallVectorImpl(&local_d0);
      return;
    }
    if (local_d0.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size == 0) {
      while( true ) {
        if (pcVar3 == pcVar4) goto LAB_00139b34;
        bVar2 = StringRef::operator[](&local_40,(size_t)pcVar4);
        if ((0x20 < bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
        if (((char)NewArgv != '\0') &&
           (cVar1 = StringRef::operator[](&local_40,(size_t)pcVar4), cVar1 == '\n')) {
          local_e8 = (char *)0x0;
          SmallVectorTemplateBase<const_char_*,_true>::push_back
                    ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_e8);
        }
        pcVar4 = pcVar4 + 1;
      }
    }
    local_e9 = StringRef::operator[](&local_40,(size_t)pcVar4);
    Saver = (StringSaver *)local_e0;
    Index = pcVar4 + 1;
    if (local_e9 == 0x5c && Index < pcVar3) {
      cVar1 = StringRef::operator[](&local_40,(size_t)Index);
      local_e8 = (char *)CONCAT71(local_e8._1_7_,cVar1);
      SmallVectorTemplateBase<char,_true>::push_back
                (&local_d0.super_SmallVectorTemplateBase<char,_true>,(char *)&local_e8);
      Saver = (StringSaver *)local_e0;
    }
    else if (local_e9 < 0x28) {
      if ((0x100002600U >> ((ulong)local_e9 & 0x3f) & 1) == 0) {
        if ((0x8400000000U >> ((ulong)local_e9 & 0x3f) & 1) == 0) goto LAB_00139b1b;
        while( true ) {
          Saver = (StringSaver *)local_e0;
          if (Index == pcVar3) goto LAB_00139b34;
          bVar2 = StringRef::operator[](&local_40,(size_t)Index);
          Saver = (StringSaver *)local_e0;
          if (bVar2 == local_e9) break;
          cVar1 = StringRef::operator[](&local_40,(size_t)Index);
          pcVar4 = Index + 1;
          if (Index + 1 == pcVar3) {
            pcVar4 = Index;
          }
          if (cVar1 != '\\') {
            pcVar4 = Index;
          }
          cVar1 = StringRef::operator[](&local_40,(size_t)pcVar4);
          local_e8 = (char *)CONCAT71(local_e8._1_7_,cVar1);
          SmallVectorTemplateBase<char,_true>::push_back
                    (&local_d0.super_SmallVectorTemplateBase<char,_true>,(char *)&local_e8);
          Index = pcVar4 + 1;
        }
      }
      else {
        if (local_d0.super_SmallVectorTemplateBase<char,_true>.
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0) {
          S.Length._0_4_ =
               local_d0.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
          S.Data = (char *)local_d0.super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          S.Length._4_4_ = 0;
          SVar5 = StringSaver::save(local_d8,S);
          local_e8 = SVar5.Data;
          SmallVectorTemplateBase<const_char_*,_true>::push_back
                    ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_e8);
        }
        local_d0.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ =
             local_d0.super_SmallVectorTemplateBase<char,_true>.
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff00000000;
        Index = pcVar4;
      }
    }
    else {
LAB_00139b1b:
      SmallVectorTemplateBase<char,_true>::push_back
                (&local_d0.super_SmallVectorTemplateBase<char,_true>,(char *)&local_e9);
      Saver = (StringSaver *)local_e0;
      Index = pcVar4;
    }
    pcVar4 = Index + 1;
  } while( true );
}

Assistant:

void cl::TokenizeGNUCommandLine(StringRef Src, StringSaver &Saver,
                                SmallVectorImpl<const char *> &NewArgv,
                                bool MarkEOLs) {
  SmallString<128> Token;
  for (size_t I = 0, E = Src.size(); I != E; ++I) {
    // Consume runs of whitespace.
    if (Token.empty()) {
      while (I != E && isWhitespace(Src[I])) {
        // Mark the end of lines in response files
        if (MarkEOLs && Src[I] == '\n')
          NewArgv.push_back(nullptr);
        ++I;
      }
      if (I == E)
        break;
    }

    char C = Src[I];

    // Backslash escapes the next character.
    if (I + 1 < E && C == '\\') {
      ++I; // Skip the escape.
      Token.push_back(Src[I]);
      continue;
    }

    // Consume a quoted string.
    if (isQuote(C)) {
      ++I;
      while (I != E && Src[I] != C) {
        // Backslash escapes the next character.
        if (Src[I] == '\\' && I + 1 != E)
          ++I;
        Token.push_back(Src[I]);
        ++I;
      }
      if (I == E)
        break;
      continue;
    }

    // End the token if this is whitespace.
    if (isWhitespace(C)) {
      if (!Token.empty())
        NewArgv.push_back(Saver.save(StringRef(Token)).data());
      Token.clear();
      continue;
    }

    // This is a normal character.  Append it.
    Token.push_back(C);
  }

  // Append the last token after hitting EOF with no whitespace.
  if (!Token.empty())
    NewArgv.push_back(Saver.save(StringRef(Token)).data());
  // Mark the end of response files
  if (MarkEOLs)
    NewArgv.push_back(nullptr);
}